

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O0

void store_coding_context_nonrd(MACROBLOCK *x,PICK_MODE_CONTEXT *ctx)

{
  uint8_t ref_frame_type;
  byte *pbVar1;
  void *in_RSI;
  long in_RDI;
  TxfmSearchInfo *txfm_info;
  MACROBLOCKD *xd;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffffc8;
  
  pbVar1 = (byte *)(in_RDI + 0x24e08);
  *(byte *)((long)in_RSI + 0x1c8) = *pbVar1;
  *(uint *)((long)in_RSI + 0x1a4) = (uint)*pbVar1;
  memcpy(in_RSI,(void *)**(undefined8 **)(in_RDI + 0x2058),0xb0);
  *(uint *)((long)in_RSI + 0x1a4) = (uint)*pbVar1;
  ref_frame_type = av1_ref_frame_type(in_stack_ffffffffffffffc8);
  av1_copy_mbmi_ext_to_mbmi_ext_frame
            ((MB_MODE_INFO_EXT_FRAME *)((long)in_RSI + 0xb0),(MB_MODE_INFO_EXT *)(in_RDI + 0x3c70),
             ref_frame_type);
  return;
}

Assistant:

static inline void store_coding_context_nonrd(MACROBLOCK *x,
                                              PICK_MODE_CONTEXT *ctx) {
#endif  // CONFIG_INTERNAL_STATS
  MACROBLOCKD *const xd = &x->e_mbd;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  // Take a snapshot of the coding context so it can be
  // restored if we decide to encode this way
  ctx->rd_stats.skip_txfm = txfm_info->skip_txfm;

  ctx->skippable = txfm_info->skip_txfm;
#if CONFIG_INTERNAL_STATS
  ctx->best_mode_index = mode_index;
#endif  // CONFIG_INTERNAL_STATS
  ctx->mic = *xd->mi[0];
  ctx->skippable = txfm_info->skip_txfm;
  av1_copy_mbmi_ext_to_mbmi_ext_frame(&ctx->mbmi_ext_best, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
}